

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

bool __thiscall
Js::InterpreterStackFrame::
TrySetPropertyLocalFastPath<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout,PropertyId pid,
          RecyclableObject *instance,InlineCache **inlineCache,PropertyOperationFlags flags)

{
  bool bVar1;
  InlineCache *inlineCache_00;
  Var propertyValue;
  undefined1 local_80 [8];
  PropertyValueInfo info;
  
  info._56_8_ = instance;
  inlineCache_00 = GetInlineCache(this,(uint)playout->inlineCacheIndex);
  *inlineCache = inlineCache_00;
  local_80 = (undefined1  [8])0x0;
  info.m_instance = (RecyclableObject *)0x50000ffff;
  info.m_propertyIndex = 0;
  info.m_attributes = '\0';
  info.flags = InlineCacheNoFlags;
  info.cacheInfoFlag = 0;
  info.inlineCache = (InlineCache *)0x0;
  info.prop = (RecyclableObject *)0x0;
  info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
  info.functionBody = (FunctionBody *)0x0;
  info.propertyRecordUsageCache._0_4_ = 0xffffffff;
  info.propertyRecordUsageCache._5_1_ = 1;
  PropertyValueInfo::SetCacheInfo
            ((PropertyValueInfo *)local_80,*(FunctionBody **)(this + 0x88),inlineCache_00,
             (uint)playout->inlineCacheIndex,true);
  propertyValue = GetReg<unsigned_short>(this,playout->Value);
  bVar1 = CacheOperators::TrySetProperty<true,false,false,false,false,true,false,false>
                    ((RecyclableObject *)info._56_8_,SUB41((flags & PropertyOperation_Root) >> 1,0),
                     pid,propertyValue,*(ScriptContext **)(this + 0x78),flags,
                     (PropertyCacheOperationInfo *)0x0,(PropertyValueInfo *)local_80);
  return bVar1;
}

Assistant:

inline bool InterpreterStackFrame::TrySetPropertyLocalFastPath(unaligned T* playout, PropertyId pid, RecyclableObject* instance, InlineCache*& inlineCache, PropertyOperationFlags flags)
    {
        inlineCache = this->GetInlineCache(playout->inlineCacheIndex);

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, GetFunctionBody(), inlineCache, playout->inlineCacheIndex, true);
        return
            CacheOperators::TrySetProperty<true, false, false, false, false, true, false, false>(
                instance,
                !!(flags & PropertyOperation_Root),
                pid,
                GetReg(playout->Value),
                GetScriptContext(),
                flags,
                nullptr,
                &info);
    }